

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_func_queue_examples.cpp
# Opt level: O2

void __thiscall
density_tests::
LfFunctionQueueSamples<(density::function_type_erasure)1,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::func_queue_try_put_samples::Func::operator()(Func *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,*(char **)this);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,*(char **)(this + 2));
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }